

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9GenSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  word *__s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint nWords0;
  uint uVar4;
  Vec_Wrd_t *pVVar5;
  word wVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  uint fVerbose;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint local_44;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  local_44 = 0xffffffff;
  nWords0 = 4;
  bVar1 = false;
  fVerbose = 0;
LAB_0024a624:
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"WRsdvh"), iVar10 = globalUtilOptind, iVar3 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar3 == -1) {
      p = pAbc->pGia;
      if (p == (Gia_Man_t *)0x0) {
        pcVar7 = "Abc_CommandAbc9GenSim(): There is no AIG.\n";
        iVar10 = -1;
        goto LAB_0024a870;
      }
      if (p->nRegs < 1) {
        if (bVar1) {
          if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
            Gia_ManPatSatImprove(p,nWords0,fVerbose);
            goto LAB_0024a931;
          }
        }
        else if (bVar2) {
          if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
            Gia_ManPatDistImprove(p,fVerbose);
            goto LAB_0024a931;
          }
        }
        else {
          if ((int)local_44 < 0) {
            Abc_Random(1);
            Vec_WrdFreeP(&pAbc->pGia->vSimsPi);
            uVar11 = (long)(int)nWords0 * (long)pAbc->pGia->vCis->nSize;
            iVar10 = (int)uVar11;
            pVVar5 = Vec_WrdAlloc(iVar10);
            pVVar5->nSize = iVar10;
            __s = pVVar5->pArray;
            uVar9 = 0;
            memset(__s,0,uVar11 * 8);
            uVar12 = 0;
            if (0 < iVar10) {
              uVar12 = uVar11 & 0xffffffff;
            }
            for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
              wVar6 = Abc_RandomW(0);
              __s[uVar9] = wVar6;
            }
            pAbc->pGia->vSimsPi = pVVar5;
            printf("Generated %d random patterns (%d 64-bit data words) for each input of the AIG.\n"
                   ,(ulong)(nWords0 << 6),(ulong)nWords0);
LAB_0024a931:
            Gia_ManSimProfile(pAbc->pGia);
            return 0;
          }
          if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
            Gia_ManPatRareImprove(p,local_44,fVerbose);
            goto LAB_0024a931;
          }
        }
        pcVar7 = "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n";
      }
      else {
        pcVar7 = "Abc_CommandAbc9GenSim(): This command works only for combinational AIGs.\n";
      }
      Abc_Print(-1,pcVar7);
      return 0;
    }
    if (iVar3 == 0x52) {
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-R\" should be followed by an integer.\n";
LAB_0024a7ac:
        Abc_Print(-1,pcVar7);
        goto LAB_0024a7b6;
      }
      local_44 = atoi(argv[globalUtilOptind]);
      uVar4 = local_44;
    }
    else {
      if (iVar3 == 0x73) {
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_0024a624;
      }
      if (iVar3 == 100) {
        bVar2 = (bool)(bVar2 ^ 1);
        goto LAB_0024a624;
      }
      if (iVar3 != 0x57) goto LAB_0024a7b6;
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0024a7ac;
      }
      nWords0 = atoi(argv[globalUtilOptind]);
      uVar4 = nWords0;
    }
    globalUtilOptind = iVar10 + 1;
    if ((int)uVar4 < 0) {
LAB_0024a7b6:
      iVar10 = -2;
      Abc_Print(-2,"usage: &sim_gen [-WR num] [-sdvh]\n");
      Abc_Print(-2,"\t         generates random simulation patterns\n");
      Abc_Print(-2,"\t-W num : the number of 64-bit words of simulation info [default = %d]\n",
                (ulong)nWords0);
      Abc_Print(-2,"\t-R num : the rarity parameter used to define scope [default = %d]\n",
                (ulong)local_44);
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (!bVar1) {
        pcVar7 = "no";
      }
      Abc_Print(-2,
                "\t-s     : toggle using SAT-based improvement of available patterns [default = %s]\n"
                ,pcVar7);
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using one improvement of available patterns [default = %s]\n",
                pcVar7);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      pcVar7 = "\t-h     : print the command usage\n";
LAB_0024a870:
      Abc_Print(iVar10,pcVar7);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GenSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManSimProfile( Gia_Man_t * pGia );
    extern void Gia_ManPatSatImprove( Gia_Man_t * pGia, int nWords, int fVerbose );
    extern void Gia_ManPatDistImprove( Gia_Man_t * p, int fVerbose );
    extern void Gia_ManPatRareImprove( Gia_Man_t * p, int RareLimit, int fVerbose );
    int c, nWords = 4, nRare = -1, fDist = 0, fSatBased = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRsdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRare = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRare < 0 )
                goto usage;
            break;
        case 's':
            fSatBased ^= 1;
            break;
        case 'd':
            fDist ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GenSim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9GenSim(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    if ( fSatBased )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatSatImprove( pAbc->pGia, nWords, fVerbose );
    }
    else if ( fDist )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatDistImprove( pAbc->pGia, fVerbose );
    }
    else if ( nRare >= 0 )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatRareImprove( pAbc->pGia, nRare, fVerbose );
    }
    else
    {
        Abc_Random(1);
        Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
        pAbc->pGia->vSimsPi = Vec_WrdStartRandom( Gia_ManCiNum(pAbc->pGia) * nWords );
        printf( "Generated %d random patterns (%d 64-bit data words) for each input of the AIG.\n", 64*nWords, nWords );
    }
    Gia_ManSimProfile( pAbc->pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &sim_gen [-WR num] [-sdvh]\n" );
    Abc_Print( -2, "\t         generates random simulation patterns\n" );
    Abc_Print( -2, "\t-W num : the number of 64-bit words of simulation info [default = %d]\n",            nWords );
    Abc_Print( -2, "\t-R num : the rarity parameter used to define scope [default = %d]\n",                nRare );
    Abc_Print( -2, "\t-s     : toggle using SAT-based improvement of available patterns [default = %s]\n", fSatBased? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using one improvement of available patterns [default = %s]\n",       fDist? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                      fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}